

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O3

int SearchVocab(char *word)

{
  int iVar1;
  vocab_word *pvVar2;
  int *piVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  
  sVar5 = strlen(word);
  piVar3 = vocab_hash;
  pvVar2 = vocab;
  uVar8 = 0;
  if (sVar5 != 0) {
    sVar6 = 0;
    do {
      uVar8 = (long)word[sVar6] + uVar8 * 0x101;
      sVar6 = sVar6 + 1;
    } while (sVar5 != sVar6);
    uVar8 = (ulong)(uint)((int)uVar8 + (int)(uVar8 / 30000000) * -30000000);
  }
  iVar1 = vocab_hash[uVar8];
  while( true ) {
    if (iVar1 == -1) {
      return -1;
    }
    iVar4 = strcmp(word,pvVar2[iVar1].word);
    if (iVar4 == 0) break;
    uVar7 = (int)uVar8 + 1;
    if (uVar7 == 30000000) {
      uVar7 = 0;
    }
    uVar8 = (ulong)uVar7;
    iVar1 = piVar3[uVar8];
  }
  return iVar1;
}

Assistant:

int SearchVocab(char *word) {
  unsigned int hash = GetWordHash(word);
  while (1) {
    if (vocab_hash[hash] == -1) return -1;
    if (!strcmp(word, vocab[vocab_hash[hash]].word)) return vocab_hash[hash];
    hash = (hash + 1) % vocab_hash_size;
  }
  return -1;
}